

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.hpp
# Opt level: O0

void __thiscall CorUnix::CSynchData::CSynchData(CSynchData *this)

{
  CSynchData *this_local;
  
  this->m_ulcWaitingThreads = 0;
  this->m_shridThis = 0;
  this->m_lRefCount = 1;
  this->m_lSignalCount = 0;
  this->m_lOwnershipCount = 0;
  this->m_dwOwnerPid = 0;
  this->m_dwOwnerTid = 0;
  this->m_pOwnerThread = (CPalThread *)0x0;
  this->m_poolnOwnedObjectListNode = (OwnedObjectsListNode *)0x0;
  this->m_fAbandoned = false;
  return;
}

Assistant:

CSynchData() 
            : m_ulcWaitingThreads(0), m_shridThis(NULLSharedID), m_lRefCount(1),
              m_lSignalCount(0), m_lOwnershipCount(0), m_dwOwnerPid(0),
              m_dwOwnerTid(0), m_pOwnerThread(NULL), 
              m_poolnOwnedObjectListNode(NULL), m_fAbandoned(false)
        { 
            // m_ptrWTLHead, m_ptrWTLTail, m_odObjectDomain 
            // and m_otiObjectTypeId are initialized by
            // CPalSynchronizationManager::AllocateObjectSynchData
#ifdef SYNCH_STATISTICS
            m_lStatWaitCount = 0;
            m_lStatContentionCount = 0;
#endif
#ifdef SYNCH_OBJECT_VALIDATION
            ValidateEmptyObject();
            m_dwDebugHeadSignature = HeadSignature;;
            m_dwDebugTailSignature = TailSignature;
#endif
        }